

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddPort.c
# Opt level: O1

DdNode * zddPortFromBddStep(DdManager *dd,DdNode *B,int expected)

{
  int *piVar1;
  uint id;
  int iVar2;
  DdNode *pDVar3;
  DdNode *T;
  DdNode *pDVar4;
  long lVar5;
  uint *puVar6;
  
  pDVar3 = dd->one;
  if ((DdNode *)((ulong)pDVar3 ^ 1) == B) {
    pDVar3 = dd->zero;
  }
  else if (pDVar3 == B) {
    if (expected < dd->sizeZ) {
      pDVar3 = dd->univ[expected];
    }
  }
  else {
    puVar6 = (uint *)((ulong)B & 0xfffffffffffffffe);
    pDVar3 = cuddCacheLookup1Zdd(dd,Cudd_zddPortFromBdd,B);
    if (pDVar3 == (DdNode *)0x0) {
      pDVar3 = *(DdNode **)(puVar6 + 4);
      if (((ulong)B & 1) == 0) {
        pDVar4 = *(DdNode **)(puVar6 + 6);
      }
      else {
        pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
        pDVar4 = (DdNode *)(*(ulong *)(puVar6 + 6) ^ 1);
      }
      id = *puVar6;
      iVar2 = 0x7fffffff;
      if ((long)(int)id != 0x7fffffff) {
        iVar2 = dd->perm[(int)id];
      }
      T = zddPortFromBddStep(dd,pDVar3,iVar2 + 1);
      if (T != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar3 = zddPortFromBddStep(dd,pDVar4,iVar2 + 1);
        if (pDVar3 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar4 = cuddZddGetNode(dd,id,T,pDVar3);
          if (pDVar4 != (DdNode *)0x0) {
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            Cudd_RecursiveDerefZdd(dd,T);
            Cudd_RecursiveDerefZdd(dd,pDVar3);
            cuddCacheInsert1(dd,Cudd_zddPortFromBdd,B,pDVar4);
            if (expected < iVar2) {
              lVar5 = (long)iVar2;
              T = pDVar4;
              do {
                pDVar4 = cuddZddGetNode(dd,dd->invperm[lVar5 + -1],T,T);
                if (pDVar4 == (DdNode *)0x0) goto LAB_007a4098;
                lVar5 = lVar5 + -1;
                piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                Cudd_RecursiveDerefZdd(dd,T);
                T = pDVar4;
              } while (expected < lVar5);
            }
            piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            return pDVar4;
          }
          Cudd_RecursiveDerefZdd(dd,T);
          T = pDVar3;
        }
LAB_007a4098:
        Cudd_RecursiveDerefZdd(dd,T);
      }
      pDVar3 = (DdNode *)0x0;
    }
    else {
      iVar2 = 0x7fffffff;
      if ((ulong)*puVar6 != 0x7fffffff) {
        iVar2 = dd->perm[*puVar6];
      }
      if (expected < iVar2) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        lVar5 = (long)iVar2;
        T = pDVar3;
        do {
          pDVar3 = cuddZddGetNode(dd,dd->invperm[lVar5 + -1],T,T);
          if (pDVar3 == (DdNode *)0x0) goto LAB_007a4098;
          lVar5 = lVar5 + -1;
          piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDerefZdd(dd,T);
          T = pDVar3;
        } while (expected < lVar5);
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
      }
    }
  }
  return pDVar3;
}

Assistant:

static DdNode *
zddPortFromBddStep(
  DdManager * dd,
  DdNode * B,
  int  expected)
{
    DdNode      *res, *prevZdd, *t, *e;
    DdNode      *Breg, *Bt, *Be;
    int         id, level;

    statLine(dd);
    /* Terminal cases. */
    if (B == Cudd_Not(DD_ONE(dd)))
        return(DD_ZERO(dd));
    if (B == DD_ONE(dd)) {
        if (expected >= dd->sizeZ) {
            return(DD_ONE(dd));
        } else {
            return(dd->univ[expected]);
        }
    }

    Breg = Cudd_Regular(B);

    /* Computed table look-up. */
    res = cuddCacheLookup1Zdd(dd,Cudd_zddPortFromBdd,B);
    if (res != NULL) {
        level = cuddI(dd,Breg->index);
        /* Adding DC vars. */
        if (expected < level) {
            /* Add suppressed variables. */
            cuddRef(res);
            for (level--; level >= expected; level--) {
                prevZdd = res;
                id = dd->invperm[level];
                res = cuddZddGetNode(dd, id, prevZdd, prevZdd);
                if (res == NULL) {
                    Cudd_RecursiveDerefZdd(dd, prevZdd);
                    return(NULL);
                }
                cuddRef(res);
                Cudd_RecursiveDerefZdd(dd, prevZdd);
            }
            cuddDeref(res);
        }
        return(res);
    }   /* end of cache look-up */

    if (Cudd_IsComplement(B)) {
        Bt = Cudd_Not(cuddT(Breg));
        Be = Cudd_Not(cuddE(Breg));
    } else {
        Bt = cuddT(Breg);
        Be = cuddE(Breg);
    }

    id = Breg->index;
    level = cuddI(dd,id);
    t = zddPortFromBddStep(dd, Bt, level+1);
    if (t == NULL) return(NULL);
    cuddRef(t);
    e = zddPortFromBddStep(dd, Be, level+1);
    if (e == NULL) {
        Cudd_RecursiveDerefZdd(dd, t);
        return(NULL);
    }
    cuddRef(e);
    res = cuddZddGetNode(dd, id, t, e);
    if (res == NULL) {
        Cudd_RecursiveDerefZdd(dd, t);
        Cudd_RecursiveDerefZdd(dd, e);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDerefZdd(dd, t);
    Cudd_RecursiveDerefZdd(dd, e);

    cuddCacheInsert1(dd,Cudd_zddPortFromBdd,B,res);

    for (level--; level >= expected; level--) {
        prevZdd = res;
        id = dd->invperm[level];
        res = cuddZddGetNode(dd, id, prevZdd, prevZdd);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(dd, prevZdd);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDerefZdd(dd, prevZdd);
    }

    cuddDeref(res);
    return(res);

}